

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

int __thiscall
CRegexSearcherSimple::compile_and_search
          (CRegexSearcherSimple *this,char *patstr,size_t patlen,char *entirestr,char *searchstr,
          size_t searchlen,int *result_len)

{
  re_status_t rVar1;
  int iVar2;
  re_compiled_pattern_base pat;
  
  this->group_cnt_ = 0;
  *(undefined4 *)&(this->super_CRegexSearcher).field_0x24 = 0xffffffff;
  *(undefined4 *)&this->field_0x28 = 0xffffffff;
  *(undefined4 *)&this->field_0x2c = 0xffffffff;
  *(undefined4 *)&this->field_0x30 = 0xffffffff;
  *(undefined4 *)&this->field_0x34 = 0xffffffff;
  *(undefined4 *)&this->field_0x38 = 0xffffffff;
  *(undefined4 *)&this->field_0x3c = 0xffffffff;
  *(undefined4 *)&this->field_0x40 = 0xffffffff;
  *(undefined4 *)&this->field_0x44 = 0xffffffff;
  *(undefined4 *)&this->field_0x48 = 0xffffffff;
  *(undefined4 *)&this->field_0x4c = 0xffffffff;
  *(undefined4 *)&this->field_0x50 = 0xffffffff;
  *(undefined4 *)&this->field_0x54 = 0xffffffff;
  *(undefined4 *)&this->field_0x58 = 0xffffffff;
  *(undefined4 *)&this->field_0x5c = 0xffffffff;
  *(undefined4 *)&this->field_0x60 = 0xffffffff;
  *(undefined4 *)&this->field_0x64 = 0xffffffff;
  *(undefined4 *)&this->field_0x68 = 0xffffffff;
  *(undefined4 *)&this->field_0x6c = 0xffffffff;
  *(undefined4 *)&this->field_0x70 = 0xffffffff;
  (this->match_).start_ofs = -1;
  (this->match_).end_ofs = -1;
  rVar1 = CRegexParser::compile(this->parser_,patstr,patlen,&pat);
  iVar2 = -1;
  if (rVar1 == RE_STATUS_SUCCESS) {
    this->group_cnt_ = pat.group_cnt;
    iVar2 = CRegexSearcher::search
                      (&this->super_CRegexSearcher,entirestr,searchstr,searchlen,&pat,
                       this->parser_->tuple_arr_,&pat.machine,
                       (re_group_register_conflict *)&(this->super_CRegexSearcher).field_0x24,
                       result_len);
    if (-1 < iVar2) {
      (this->match_).start_ofs = iVar2;
      (this->match_).end_ofs = *result_len + iVar2;
    }
  }
  return iVar2;
}

Assistant:

int CRegexSearcherSimple::compile_and_search(
    const char *patstr, size_t patlen,
    const char *entirestr, const char *searchstr, size_t searchlen,
    int *result_len)
{
    /* no groups yet */
    group_cnt_ = 0;

    /* clear the group registers */
    clear_group_regs();

    /* compile the expression - return failure if we get an error */
    re_compiled_pattern_base pat;
    if (parser_->compile(patstr, patlen, &pat) != RE_STATUS_SUCCESS)
        return -1;

    /* remember the group count from the compiled pattern */
    group_cnt_ = pat.group_cnt;

    /* 
     *   search for the pattern in our copy of the string - use the copy so
     *   that the group registers stay valid even if the caller deallocates
     *   the original string after we return 
     */
    int m = search(entirestr, searchstr, searchlen,
                   &pat, parser_->tuple_arr_, &pat.machine,
                   regs_, result_len);

    /* save the match information on success */
    if (m >= 0)
    {
        match_.start_ofs = m;
        match_.end_ofs = m + *result_len;
    }

    /* return the result */
    return m;
}